

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

Value __thiscall luna::Table::GetValue(Table *this,Value *key)

{
  double __x;
  vector<luna::Value,_std::allocator<luna::Value>_> *pvVar1;
  _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  long lVar2;
  bool bVar3;
  iterator iVar4;
  ulong uVar5;
  ulong unaff_RBP;
  ulong uVar6;
  anon_union_8_9_8deb4486_for_Value_0 unaff_R15;
  double dVar7;
  Value VVar8;
  
  if (key->type_ == ValueT_Number) {
    __x = (key->field_0).num_;
    dVar7 = floor(__x);
    if ((dVar7 == __x) && (!NAN(dVar7) && !NAN(__x))) {
      uVar5 = (long)(__x - 9.223372036854776e+18) & (long)__x >> 0x3f | (long)__x;
      bVar3 = true;
      if (uVar5 != 0) {
        pvVar1 = (this->array_)._M_t.
                 super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
                 ._M_head_impl;
        if (pvVar1 == (vector<luna::Value,_std::allocator<luna::Value>_> *)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (long)*(pointer *)
                         ((long)&(pvVar1->
                                 super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                                 _M_impl + 8) -
                  *(long *)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                            _M_impl >> 4;
        }
        if (uVar5 <= uVar6) {
          lVar2 = *(long *)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                            _M_impl;
          unaff_R15 = (anon_union_8_9_8deb4486_for_Value_0)
                      ((anon_union_8_9_8deb4486_for_Value_0 *)(lVar2 + -0x10 + uVar5 * 0x10))->obj_;
          unaff_RBP = (ulong)*(uint *)(lVar2 + -8 + uVar5 * 0x10);
          bVar3 = false;
        }
      }
      if (!bVar3) goto LAB_001101be;
    }
  }
  this_00 = &((this->hash_)._M_t.
              super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
             ._M_head_impl)->_M_h;
  if ((this_00 ==
       (_Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        *)0x0) ||
     (iVar4 = std::
              _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(this_00,key),
     iVar4.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>._M_cur ==
     (__node_type *)0x0)) {
    unaff_R15.obj_ = (GCObject *)0x0;
    unaff_RBP = 0;
  }
  else {
    unaff_R15 = (anon_union_8_9_8deb4486_for_Value_0)
                ((anon_union_8_9_8deb4486_for_Value_0 *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>.
                       _M_cur + 0x18))->obj_;
    unaff_RBP = (ulong)*(uint *)((long)iVar4.
                                       super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>
                                       ._M_cur + 0x20);
  }
LAB_001101be:
  VVar8._8_8_ = unaff_RBP & 0xffffffff;
  VVar8.field_0.obj_ = unaff_R15.obj_;
  return VVar8;
}

Assistant:

Value Table::GetValue(const Value &key) const
    {
        // Get from array first
        if (key.type_ == ValueT_Number && IsInt(key.num_))
        {
            std::size_t index = static_cast<std::size_t>(key.num_);
            if (index >= 1 && index <= ArraySize())
                return (*array_)[index - 1];
        }

        // Get from hash table
        if (hash_)
        {
            auto it = hash_->find(key);
            if (it != hash_->end())
                return it->second;
        }

        // key not exist
        return Value();
    }